

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O0

void Res_SimSetRandomBytes(Res_Sim_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  uint *p_00;
  int local_24;
  int i;
  uint *pInfo;
  Abc_Obj_t *pObj;
  Res_Sim_t *p_local;
  
  for (local_24 = 0; iVar1 = Abc_NtkPiNum(p->pAig), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPi(p->pAig,local_24);
    p_00 = (uint *)Vec_PtrEntry(p->vPats,pAVar2->Id);
    if (local_24 < p->nTruePis) {
      Abc_InfoRandomBytes(p_00,p->nWordsIn);
    }
    else {
      Abc_InfoRandom(p_00,p->nWordsIn);
    }
  }
  return;
}

Assistant:

void Res_SimSetRandomBytes( Res_Sim_t * p )
{
    Abc_Obj_t * pObj;
    unsigned * pInfo;
    int i;
    Abc_NtkForEachPi( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vPats, pObj->Id );
        if ( i < p->nTruePis )
            Abc_InfoRandomBytes( pInfo, p->nWordsIn );
        else
            Abc_InfoRandom( pInfo, p->nWordsIn );
    }
/*
    // double-check that all are byte-patterns
    Abc_NtkForEachPi( p->pAig, pObj, i )
    {
        if ( i == p->nTruePis )
            break;
        pInfoC = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
        for ( k = 0; k < p->nBytesIn; k++ )
            assert( pInfoC[k] == 0 || pInfoC[k] == 0xff );
    }
*/
}